

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cc
# Opt level: O2

void __thiscall
tchecker::system::attributes_t::add_attributes(attributes_t *this,attributes_t *attr)

{
  __node_base *p_Var1;
  attr_parsing_position_t aStack_68;
  
  p_Var1 = &(attr->_map)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    parsing::attr_parsing_position_t::attr_parsing_position_t
              (&aStack_68,(attr_parsing_position_t *)(p_Var1 + 0xd));
    add_attribute(this,(string *)(p_Var1 + 5),(string *)(p_Var1 + 9),
                  (attr_parsing_position_t *)&aStack_68);
    parsing::attr_parsing_position_t::~attr_parsing_position_t(&aStack_68);
  }
  return;
}

Assistant:

void attributes_t::add_attributes(tchecker::system::attributes_t const & attr)
{
  for (auto && attr : attr.range())
    add_attribute(attr.key(), attr.value(), attr.parsing_position());
}